

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

Expression * __thiscall
wasm::OptimizeInstructions::optimizeMemoryCopy(OptimizeInstructions *this,MemoryCopy *memCopy)

{
  Expression *pEVar1;
  Expression *pEVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  OptimizeInstructions *pOVar6;
  Const *pCVar7;
  Module *pMVar8;
  Load *pLVar9;
  Type local_140;
  size_t local_138;
  char *local_130;
  Type local_128;
  Address local_120;
  Address local_118;
  size_t local_110;
  char *local_108;
  Type local_100;
  size_t local_f8;
  char *local_f0;
  Type local_e8;
  Address local_e0;
  Address local_d8;
  size_t local_d0;
  char *local_c8;
  Type local_c0;
  size_t local_b8;
  char *local_b0;
  Type local_a8;
  Address local_a0;
  Address local_98;
  Drop *local_90;
  Drop *local_88;
  initializer_list<wasm::Expression_*> local_80;
  Builder local_70;
  Builder builder_1;
  int64_t bytes;
  Const *csize;
  Drop *local_50;
  Drop *local_48;
  initializer_list<wasm::Expression_*> local_40;
  Builder local_30;
  Builder builder;
  PassOptions *options;
  MemoryCopy *memCopy_local;
  OptimizeInstructions *this_local;
  
  builder.wasm = (Module *)Pass::getPassOptions((Pass *)this);
  if (((((ulong)((builder.wasm)->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish & 1) != 0) ||
      (((ulong)((builder.wasm)->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish & 0x100) != 0)) &&
     (bVar3 = areConsecutiveInputsEqual(this,memCopy->dest,memCopy->source), bVar3)) {
    pMVar8 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                        ).
                        super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                        .
                        super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      );
    Builder::Builder(&local_30,pMVar8);
    csize = (Const *)Builder::makeDrop(&local_30,memCopy->dest);
    local_50 = Builder::makeDrop(&local_30,memCopy->source);
    local_48 = Builder::makeDrop(&local_30,memCopy->size);
    local_40._M_array = (iterator)&csize;
    local_40._M_len = 3;
    pOVar6 = (OptimizeInstructions *)Builder::makeBlock(&local_30,&local_40);
    return (Expression *)pOVar6;
  }
  pCVar7 = Expression::dynCast<wasm::Const>(memCopy->size);
  if (pCVar7 != (Const *)0x0) {
    builder_1.wasm = (Module *)wasm::Literal::getInteger(&pCVar7->value);
    pMVar8 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                        ).
                        super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                        .
                        super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      );
    Builder::Builder(&local_70,pMVar8);
    uVar4 = (uint)builder_1.wasm;
    switch(builder_1.wasm) {
    case (Module *)0x0:
      if ((((ulong)((builder.wasm)->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish & 1) != 0) ||
         (((ulong)((builder.wasm)->functions).
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish & 0x100) != 0)) {
        local_90 = Builder::makeDrop(&local_70,memCopy->dest);
        local_88 = Builder::makeDrop(&local_70,memCopy->source);
        local_80._M_array = (iterator)&local_90;
        local_80._M_len = 2;
        pOVar6 = (OptimizeInstructions *)Builder::makeBlock(&local_70,&local_80);
        return (Expression *)pOVar6;
      }
      break;
    case (Module *)0x1:
    case (Module *)0x2:
    case (Module *)0x4:
      wasm::Address::Address(&local_98,0);
      pEVar1 = memCopy->dest;
      uVar5 = (uint)builder_1.wasm;
      wasm::Address::Address(&local_a0,0);
      pEVar2 = memCopy->source;
      wasm::Type::Type(&local_a8,i32);
      local_b8 = (memCopy->sourceMemory).super_IString.str._M_len;
      local_b0 = (memCopy->sourceMemory).super_IString.str._M_str;
      pLVar9 = Builder::makeLoad(&local_70,uVar5,false,local_a0,1,pEVar2,local_a8,
                                 (Name)(memCopy->sourceMemory).super_IString.str);
      wasm::Type::Type(&local_c0,i32);
      local_d0 = (memCopy->destMemory).super_IString.str._M_len;
      local_c8 = (memCopy->destMemory).super_IString.str._M_str;
      pOVar6 = (OptimizeInstructions *)
               Builder::makeStore(&local_70,uVar4,local_98,1,pEVar1,(Expression *)pLVar9,local_c0,
                                  (Name)(memCopy->destMemory).super_IString.str);
      return (Expression *)pOVar6;
    default:
      break;
    case (Module *)0x8:
      wasm::Address::Address(&local_d8,0);
      pEVar1 = memCopy->dest;
      uVar5 = (uint)builder_1.wasm;
      wasm::Address::Address(&local_e0,0);
      pEVar2 = memCopy->source;
      wasm::Type::Type(&local_e8,i64);
      local_f8 = (memCopy->sourceMemory).super_IString.str._M_len;
      local_f0 = (memCopy->sourceMemory).super_IString.str._M_str;
      pLVar9 = Builder::makeLoad(&local_70,uVar5,false,local_e0,1,pEVar2,local_e8,
                                 (Name)(memCopy->sourceMemory).super_IString.str);
      wasm::Type::Type(&local_100,i64);
      local_110 = (memCopy->destMemory).super_IString.str._M_len;
      local_108 = (memCopy->destMemory).super_IString.str._M_str;
      pOVar6 = (OptimizeInstructions *)
               Builder::makeStore(&local_70,uVar4,local_d8,1,pEVar1,(Expression *)pLVar9,local_100,
                                  (Name)(memCopy->destMemory).super_IString.str);
      return (Expression *)pOVar6;
    case (Module *)0x10:
      if (*(int *)&((builder.wasm)->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish == 0) {
        pMVar8 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 ::getModule(&(this->
                              super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                              ).
                              super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                              .
                              super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                            );
        bVar3 = FeatureSet::hasSIMD(&pMVar8->features);
        if (bVar3) {
          uVar4 = (uint)builder_1.wasm;
          wasm::Address::Address(&local_118,0);
          pEVar1 = memCopy->dest;
          uVar5 = (uint)builder_1.wasm;
          wasm::Address::Address(&local_120,0);
          pEVar2 = memCopy->source;
          wasm::Type::Type(&local_128,v128);
          local_138 = (memCopy->sourceMemory).super_IString.str._M_len;
          local_130 = (memCopy->sourceMemory).super_IString.str._M_str;
          pLVar9 = Builder::makeLoad(&local_70,uVar5,false,local_120,1,pEVar2,local_128,
                                     (Name)(memCopy->sourceMemory).super_IString.str);
          wasm::Type::Type(&local_140,v128);
          pOVar6 = (OptimizeInstructions *)
                   Builder::makeStore(&local_70,uVar4,local_118,1,pEVar1,(Expression *)pLVar9,
                                      local_140,(Name)(memCopy->destMemory).super_IString.str);
          return (Expression *)pOVar6;
        }
      }
    }
  }
  return (Expression *)(OptimizeInstructions *)0x0;
}

Assistant:

Expression* optimizeMemoryCopy(MemoryCopy* memCopy) {
    auto& options = getPassOptions();

    if (options.ignoreImplicitTraps || options.trapsNeverHappen) {
      if (areConsecutiveInputsEqual(memCopy->dest, memCopy->source)) {
        // memory.copy(x, x, sz)  ==>  {drop(x), drop(x), drop(sz)}
        Builder builder(*getModule());
        return builder.makeBlock({builder.makeDrop(memCopy->dest),
                                  builder.makeDrop(memCopy->source),
                                  builder.makeDrop(memCopy->size)});
      }
    }

    // memory.copy(dst, src, C)  ==>  store(dst, load(src))
    if (auto* csize = memCopy->size->dynCast<Const>()) {
      auto bytes = csize->value.getInteger();
      Builder builder(*getModule());

      switch (bytes) {
        case 0: {
          if (options.ignoreImplicitTraps || options.trapsNeverHappen) {
            // memory.copy(dst, src, 0)  ==>  {drop(dst), drop(src)}
            return builder.makeBlock({builder.makeDrop(memCopy->dest),
                                      builder.makeDrop(memCopy->source)});
          }
          break;
        }
        case 1:
        case 2:
        case 4: {
          return builder.makeStore(bytes, // bytes
                                   0,     // offset
                                   1,     // align
                                   memCopy->dest,
                                   builder.makeLoad(bytes,
                                                    false,
                                                    0,
                                                    1,
                                                    memCopy->source,
                                                    Type::i32,
                                                    memCopy->sourceMemory),
                                   Type::i32,
                                   memCopy->destMemory);
        }
        case 8: {
          return builder.makeStore(bytes, // bytes
                                   0,     // offset
                                   1,     // align
                                   memCopy->dest,
                                   builder.makeLoad(bytes,
                                                    false,
                                                    0,
                                                    1,
                                                    memCopy->source,
                                                    Type::i64,
                                                    memCopy->sourceMemory),
                                   Type::i64,
                                   memCopy->destMemory);
        }
        case 16: {
          if (options.shrinkLevel == 0) {
            // This adds an extra 2 bytes so apply it only for
            // minimal shrink level
            if (getModule()->features.hasSIMD()) {
              return builder.makeStore(bytes, // bytes
                                       0,     // offset
                                       1,     // align
                                       memCopy->dest,
                                       builder.makeLoad(bytes,
                                                        false,
                                                        0,
                                                        1,
                                                        memCopy->source,
                                                        Type::v128,
                                                        memCopy->sourceMemory),
                                       Type::v128,
                                       memCopy->destMemory);
            }
          }
          break;
        }
        default: {
        }
      }
    }
    return nullptr;
  }